

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# freecell.c
# Opt level: O2

_Bool freecell_isWon(Board *board)

{
  byte bVar1;
  Spot *pSVar2;
  byte spotIndex;
  
  bVar1 = 0;
  do {
    spotIndex = bVar1;
    if (spotIndex == 4) break;
    pSVar2 = board_spotGet(board,FOUNDATION,spotIndex);
    bVar1 = spotIndex + 1;
  } while (pSVar2->cardsCount == '\r');
  return 3 < spotIndex;
}

Assistant:

bool freecell_isWon(Board * board)
{
	unsigned char i;
	Spot * foundation;
	for(i=0;i<4;i++)
	{
		foundation = board_spotGet(board, FOUNDATION, i);
		if(foundation->cardsCount!=13)
			return false;
	}

	return true;
}